

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3RollbackMethod(sqlite3_vtab *pVtab)

{
  Fts3Table *unaff_retaddr;
  Fts3Table *p;
  
  sqlite3Fts3PendingTermsClear(unaff_retaddr);
  return 0;
}

Assistant:

static int fts3RollbackMethod(sqlite3_vtab *pVtab){
  Fts3Table *p = (Fts3Table*)pVtab;
  sqlite3Fts3PendingTermsClear(p);
  assert( p->inTransaction!=0 );
  TESTONLY( p->inTransaction = 0 );
  TESTONLY( p->mxSavepoint = -1; );
  return SQLITE_OK;
}